

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetOrder(void *arkode_mem,int ord)

{
  int iVar1;
  int iVar2;
  int error_code;
  undefined4 in_register_00000034;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x7b;
  }
  else {
    if (*(code **)((long)arkode_mem + 0xe8) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0xe8))(arkode_mem,CONCAT44(in_register_00000034,ord));
      return iVar1;
    }
    msgfmt = "time-stepping module does not support this function";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x88;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetOrder",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetOrder(void* arkode_mem, int ord)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper routine (if provided) */
  if (ark_mem->step_setorder)
  {
    return (ark_mem->step_setorder(arkode_mem, ord));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}